

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlmemory.c
# Opt level: O1

void * xmlReallocLoc(void *ptr,size_t size,char *file,int line)

{
  int *__ptr;
  ulong uVar1;
  xmlGenericErrorFunc p_Var2;
  xmlGenericErrorFunc *pp_Var3;
  void **ppvVar4;
  void *pvVar5;
  undefined8 *puVar6;
  
  if (ptr != (void *)0x0) {
    if (xmlMemInitialized == '\0') {
      xmlInitMemory();
    }
    __ptr = (int *)((long)ptr + -0x28);
    uVar1 = *(ulong *)((long)ptr + -0x20);
    if (uVar1 == xmlMemStopAtBlock) {
      pp_Var3 = __xmlGenericError();
      p_Var2 = *pp_Var3;
      ppvVar4 = __xmlGenericErrorContext();
      (*p_Var2)(*ppvVar4,"xmlMallocBreakpoint reached on block %d\n",(ulong)xmlMemStopAtBlock);
    }
    if (*__ptr == 0x5aa5) {
      *(undefined4 *)((long)ptr + -0x28) = 0xffffa55a;
      xmlMutexLock(xmlMemMutex);
      debugMemSize = debugMemSize - *(long *)((long)ptr + -0x18);
      debugMemBlocks = debugMemBlocks - 1;
      xmlMutexUnlock(xmlMemMutex);
      if (size < 0xffffffffffffffd8) {
        puVar6 = (undefined8 *)realloc(__ptr,size + 0x28);
        if (puVar6 == (undefined8 *)0x0) {
          free(__ptr);
          puVar6 = (undefined8 *)0x0;
        }
        else {
          if (xmlMemTraceBlockAt == ptr) {
            pp_Var3 = __xmlGenericError();
            p_Var2 = *pp_Var3;
            ppvVar4 = __xmlGenericErrorContext();
            (*p_Var2)(*ppvVar4,"%p : Realloced(%lu -> %lu) Ok\n",xmlMemTraceBlockAt,puVar6[2],size);
            pp_Var3 = __xmlGenericError();
            p_Var2 = *pp_Var3;
            ppvVar4 = __xmlGenericErrorContext();
            (*p_Var2)(*ppvVar4,"xmlMallocBreakpoint reached on block %d\n",(ulong)xmlMemStopAtBlock)
            ;
          }
          *puVar6 = 0x200005aa5;
          puVar6[1] = uVar1;
          puVar6[2] = size;
          puVar6[3] = file;
          *(int *)(puVar6 + 4) = line;
          xmlMutexLock(xmlMemMutex);
          debugMemSize = size + debugMemSize;
          debugMemBlocks = debugMemBlocks + 1;
          if (debugMaxMemSize < debugMemSize) {
            debugMaxMemSize = debugMemSize;
          }
          xmlMutexUnlock(xmlMemMutex);
          puVar6 = puVar6 + 5;
        }
      }
      else {
        pp_Var3 = __xmlGenericError();
        p_Var2 = *pp_Var3;
        ppvVar4 = __xmlGenericErrorContext();
        puVar6 = (undefined8 *)0x0;
        (*p_Var2)(*ppvVar4,"xmlReallocLoc : Unsigned overflow\n");
      }
    }
    else {
      pp_Var3 = __xmlGenericError();
      p_Var2 = *pp_Var3;
      ppvVar4 = __xmlGenericErrorContext();
      puVar6 = (undefined8 *)0x0;
      (*p_Var2)(*ppvVar4,"Memory tag error occurs :%p \n\t bye\n",__ptr);
    }
    return puVar6;
  }
  pvVar5 = xmlMallocLoc(size,file,line);
  return pvVar5;
}

Assistant:

void *
xmlReallocLoc(void *ptr,size_t size, const char * file, int line)
{
    MEMHDR *p, *tmp;
    unsigned long number;
#ifdef DEBUG_MEMORY
    size_t oldsize;
#endif

    if (ptr == NULL)
        return(xmlMallocLoc(size, file, line));

    if (!xmlMemInitialized) xmlInitMemory();
    TEST_POINT

    p = CLIENT_2_HDR(ptr);
    number = p->mh_number;
    if (xmlMemStopAtBlock == number) xmlMallocBreakpoint();
    if (p->mh_tag != MEMTAG) {
       Mem_Tag_Err(p);
	 goto error;
    }
    p->mh_tag = ~MEMTAG;
    xmlMutexLock(xmlMemMutex);
    debugMemSize -= p->mh_size;
    debugMemBlocks--;
#ifdef DEBUG_MEMORY
    oldsize = p->mh_size;
#endif
#ifdef MEM_LIST
    debugmem_list_delete(p);
#endif
    xmlMutexUnlock(xmlMemMutex);

    if (size > (MAX_SIZE_T - RESERVE_SIZE)) {
	xmlGenericError(xmlGenericErrorContext,
		"xmlReallocLoc : Unsigned overflow\n");
	xmlMemoryDump();
	return(NULL);
    }

    tmp = (MEMHDR *) realloc(p,RESERVE_SIZE+size);
    if (!tmp) {
	 free(p);
	 goto error;
    }
    p = tmp;
    if (xmlMemTraceBlockAt == ptr) {
	xmlGenericError(xmlGenericErrorContext,
			"%p : Realloced(%lu -> %lu) Ok\n",
			xmlMemTraceBlockAt, (long unsigned)p->mh_size,
			(long unsigned)size);
	xmlMallocBreakpoint();
    }
    p->mh_tag = MEMTAG;
    p->mh_number = number;
    p->mh_type = REALLOC_TYPE;
    p->mh_size = size;
    p->mh_file = file;
    p->mh_line = line;
    xmlMutexLock(xmlMemMutex);
    debugMemSize += size;
    debugMemBlocks++;
    if (debugMemSize > debugMaxMemSize) debugMaxMemSize = debugMemSize;
#ifdef MEM_LIST
    debugmem_list_add(p);
#endif
    xmlMutexUnlock(xmlMemMutex);

    TEST_POINT

#ifdef DEBUG_MEMORY
    xmlGenericError(xmlGenericErrorContext,
	    "Realloced(%d to %d) Ok\n", oldsize, size);
#endif
    return(HDR_2_CLIENT(p));

error:
    return(NULL);
}